

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  double dVar1;
  ostream *this;
  undefined1 local_58 [8];
  QuantumComputer qc;
  size_t arrSize;
  double base [2];
  int numberOfQubits;
  
  arrSize = 0;
  base[0] = 1.0;
  qc.baseVector.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)std::size<double,2ul>((double (*) [2])&arrSize);
  this = (ostream *)
         std::ostream::operator<<
                   ((ostream *)&std::cout,
                    (ulong)qc.baseVector.super__Vector_base<double,_std::allocator<double>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  quantum::QuantumComputer::QuantumComputer
            ((QuantumComputer *)local_58,1,(double *)&arrSize,
             (int)qc.baseVector.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
  quantum::QuantumComputer::resetState((QuantumComputer *)local_58);
  dVar1 = sqrt(2.0);
  quantum::QuantumComputer::setValueInRegister((QuantumComputer *)local_58,0,1.0 / dVar1);
  dVar1 = sqrt(2.0);
  quantum::QuantumComputer::setValueInRegister((QuantumComputer *)local_58,1,1.0 / dVar1);
  quantum::QuantumComputer::viewProbabilityForBaseVector((QuantumComputer *)local_58);
  quantum::QuantumComputer::~QuantumComputer((QuantumComputer *)local_58);
  return 0;
}

Assistant:

int main() {

    int numberOfQubits = 1;
    double base[] = {0.0, 1.0};
    auto arrSize = std::size(base);
    std::cout<<arrSize<<std::endl;
    struct QuantumComputer qc =
            QuantumComputer(numberOfQubits, base, arrSize);
    qc.resetState();
    qc.setValueInRegister(0, 1 / (sqrt(2)));
    qc.setValueInRegister(1, 1 / (sqrt(2)));
    qc.viewProbabilityForBaseVector();

    return 0;
}